

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O1

void __thiscall
cli::Parser::set_required<std::__cxx11::string>
          (Parser *this,string *name,string *alternative,string *description,bool dominant)

{
  CmdBase *this_00;
  CmdBase *local_38;
  
  this_00 = (CmdBase *)operator_new(0xd0);
  CmdBase::CmdBase(this_00,name,alternative,description,true,dominant,false);
  this_00->_vptr_CmdBase = (_func_int **)&PTR__CmdArgument_00126bf0;
  this_00[1]._vptr_CmdBase = (_func_int **)&this_00[1].name._M_string_length;
  this_00[1].name._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&this_00[1].name._M_string_length = 0;
  local_38 = this_00;
  std::vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>>::
  emplace_back<cli::Parser::CmdBase*>
            ((vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>> *)&this->_commands
             ,&local_38);
  return;
}

Assistant:

void set_required(const std::string& name, const std::string& alternative, const std::string& description = "", bool dominant = false) {
			auto command = new CmdArgument<T> { name, alternative, description, true, dominant };
			_commands.push_back(command);
		}